

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

file_status __thiscall ghc::filesystem::status(filesystem *this,path *p)

{
  filesystem_error *this_00;
  error_code ec_00;
  error_code ec;
  string local_48;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  detail::status_ex((path *)this,(error_code *)p,(file_status *)&ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (*(int *)this != 0) {
    return (file_status)this;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_48,ec._M_value);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  filesystem_error::filesystem_error(this_00,&local_48,p,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE file_status status(const path& p)
{
    std::error_code ec;
    auto result = status(p, ec);
    if (result.type() == file_type::none) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}